

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_names_unittest.cc
# Opt level: O1

void __thiscall bssl::GeneralNames_IPAddress_v4_Test::TestBody(GeneralNames_IPAddress_v4_Test *this)

{
  undefined1 auVar1 [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  Input general_names_tlv;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> general_names;
  CertErrors errors;
  string san_der;
  AssertHelper local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Head_base<0UL,_bssl::GeneralNames_*,_false> local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  AssertHelper local_48;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_88 = (undefined1  [8])&local_78;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"san-ipaddress4.pem","");
  anon_unknown_20::LoadTestSubjectAltNameData
            ((anon_unknown_20 *)local_60,(string *)local_88,&local_40);
  if (local_88 != (undefined1  [8])&local_78) {
    operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
  }
  if (local_60[0] == (anon_unknown_20)0x0) {
    testing::Message::Message((Message *)local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_60,
               (AssertionResult *)"LoadTestSubjectAltNameData(\"san-ipaddress4.pem\", &san_der)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/general_names_unittest.cc"
               ,0xbc,(char *)local_88);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_88 != (undefined1  [8])&local_78) {
      operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
    }
    if (local_98 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
    goto LAB_0022a8d9;
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  CertErrors::CertErrors((CertErrors *)local_60);
  general_names_tlv.data_.size_ = (size_t)local_40._M_dataplus._M_p;
  general_names_tlv.data_.data_ = (uchar *)&local_68;
  GeneralNames::Create(general_names_tlv,(CertErrors *)local_40._M_string_length);
  auVar1 = local_98;
  local_98[0] = local_68._M_head_impl != (GeneralNames *)0x0;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68._M_head_impl == (GeneralNames *)0x0) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_90;
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_98,(AssertionResult *)"general_names","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/general_names_unittest.cc"
               ,0xc1,(char *)local_88);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_88 != (undefined1  [8])&local_78) {
      operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_a0.data_._4_4_,local_a0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,local_a0.data_._0_4_) + 8))();
    }
    local_80 = local_90;
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0022a8c0;
  }
  else {
    local_98._4_4_ = auVar1._4_4_;
    local_98._0_4_ = 0x80;
    testing::internal::CmpHelperEQ<bssl::GeneralNameTypes,int>
              ((internal *)local_88,"GENERAL_NAME_IP_ADDRESS","general_names->present_name_types",
               (GeneralNameTypes *)local_98,&(local_68._M_head_impl)->present_name_types);
    if (local_88[0] == (string)0x0) {
      testing::Message::Message((Message *)local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/general_names_unittest.cc"
                 ,0xc2,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_98 + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_a0.data_._0_4_ = 1;
    local_98 = (undefined1  [8])
               ((long)((local_68._M_head_impl)->ip_addresses).
                      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)((local_68._M_head_impl)->ip_addresses).
                      super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_88,"1U","general_names->ip_addresses.size()",(uint *)&local_a0,
               (unsigned_long *)local_98);
    if (local_88[0] == (string)0x0) {
      testing::Message::Message((Message *)local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/general_names_unittest.cc"
                 ,0xc3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
LAB_0022a897:
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_98 + 8))();
      }
    }
    else {
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_98 = (undefined1  [8])TestBody::kIP;
      local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
      testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
                ((internal *)local_88,"der::Input(kIP)","general_names->ip_addresses[0]",
                 (Input *)local_98,
                 ((local_68._M_head_impl)->ip_addresses).
                 super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (local_88[0] == (string)0x0) {
        testing::Message::Message((Message *)local_98);
        if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/general_names_unittest.cc"
                   ,0xc5,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_98 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_98 + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_a0.data_._0_4_ = 0;
      local_98 = (undefined1  [8])
                 ((long)((local_68._M_head_impl)->ip_address_ranges).
                        super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)((local_68._M_head_impl)->ip_address_ranges).
                        super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_88,"0U","general_names->ip_address_ranges.size()",
                 (uint *)&local_a0,(unsigned_long *)local_98);
      if (local_88[0] == (string)0x0) {
        testing::Message::Message((Message *)local_98);
        if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/general_names_unittest.cc"
                   ,0xc6,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)local_98);
        goto LAB_0022a897;
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_80;
LAB_0022a8c0:
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_80);
    }
  }
  ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::~unique_ptr
            ((unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> *)&local_68);
  CertErrors::~CertErrors((CertErrors *)local_60);
LAB_0022a8d9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST(GeneralNames, IPAddress_v6) {
  std::string san_der;
  ASSERT_TRUE(LoadTestSubjectAltNameData("san-ipaddress6.pem", &san_der));

  CertErrors errors;
  std::unique_ptr<GeneralNames> general_names =
      GeneralNames::Create(StringAsBytes(san_der), &errors);
  ASSERT_TRUE(general_names);
  EXPECT_EQ(GENERAL_NAME_IP_ADDRESS, general_names->present_name_types);
  ASSERT_EQ(1U, general_names->ip_addresses.size());
  static const uint8_t kIP[] = {0xFE, 0x80, 1, 2,  3,  4,  5,  6,
                                7,    8,    9, 10, 11, 12, 13, 14};
  EXPECT_EQ(der::Input(kIP), general_names->ip_addresses[0]);
  EXPECT_EQ(0U, general_names->ip_address_ranges.size());
}